

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype,bool in_typedef,
          bool is_const)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  t_type *ptVar4;
  runtime_error *this_00;
  t_program *this_01;
  undefined4 extraout_var;
  char *pcVar5;
  allocator local_114;
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  string pname;
  t_program *tprogram;
  t_type *etype;
  t_container *local_80;
  t_container *tcontainer;
  string cname;
  undefined1 local_48 [8];
  string bname;
  bool is_const_local;
  bool in_typedef_local;
  t_type *ttype_local;
  t_c_glib_generator *this_local;
  
  bname.field_2._M_local_buf[0xe] = is_const;
  bname.field_2._M_local_buf[0xf] = in_typedef;
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])();
    if ((uVar2 & 1) == 0) {
      this_01 = t_type::get_program(ttype);
      local_112 = 0;
      local_113 = 0;
      pname.field_2._8_8_ = this_01;
      if (this_01 == (t_program *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f0,"",&local_114);
      }
      else {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string((string *)&local_110,"c_glib",&local_111);
        local_113 = 1;
        t_program::get_namespace(&local_f0,this_01,&local_110);
      }
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar3));
      std::__cxx11::string::~string((string *)&local_f0);
      if (this_01 == (t_program *)0x0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_114);
      }
      if ((local_113 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_110);
      }
      if ((local_112 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      bVar1 = is_complex_type(this,ttype);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_d0," *");
      }
      if ((bname.field_2._M_local_buf[0xe] & 1U) == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_d0);
      }
      else {
        std::operator+(__return_storage_ptr__,"const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
      }
      cname.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_d0);
    }
    else {
      std::__cxx11::string::string((string *)&tcontainer);
      local_80 = (t_container *)ttype;
      bVar1 = t_container::has_cpp_name((t_container *)ttype);
      if (bVar1) {
        t_container::get_cpp_name_abi_cxx11_((string *)&etype,local_80);
        std::__cxx11::string::operator=((string *)&tcontainer,(string *)&etype);
        std::__cxx11::string::~string((string *)&etype);
      }
      else {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
        if ((uVar2 & 1) == 0) {
          uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((uVar2 & 1) == 0) {
            uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
            if ((uVar2 & 1) != 0) {
              ptVar4 = t_list::get_elem_type((t_list *)ttype);
              ptVar4 = t_generator::get_true_type(ptVar4);
              uVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[4])();
              if ((uVar2 & 1) != 0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"compiler error: list element type cannot be void");
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              bVar1 = is_numeric(this,ptVar4);
              pcVar5 = "GPtrArray";
              if (bVar1) {
                pcVar5 = "GArray";
              }
              std::__cxx11::string::operator=((string *)&tcontainer,pcVar5);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&tcontainer,"GHashTable");
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&tcontainer,"GHashTable");
        }
      }
      if ((bname.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)&tcontainer," *");
      }
      if ((bname.field_2._M_local_buf[0xe] & 1U) == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tcontainer);
      }
      else {
        std::operator+(__return_storage_ptr__,"const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcontainer);
      }
      cname.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)&tcontainer);
    }
  }
  else {
    base_type_name_abi_cxx11_((string *)local_48,this,ttype);
    if ((bname.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    }
    else {
      std::operator+(__return_storage_ptr__,"const ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    cname.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::type_name(t_type* ttype, bool in_typedef, bool is_const) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(ttype);

    if (is_const) {
      return "const " + bname;
    } else {
      return bname;
    }
  }

  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      cname = "GHashTable";
    } else if (ttype->is_set()) {
      // since a set requires unique elements, use a GHashTable, and
      // populate the keys and values with the same data, using keys for
      // the actual writes and reads.
      // TODO: discuss whether or not to implement TSet, THashSet or GHashSet
      cname = "GHashTable";
    } else if (ttype->is_list()) {
      t_type* etype = get_true_type(((t_list*)ttype)->get_elem_type());
      if (etype->is_void()) {
        throw std::runtime_error("compiler error: list element type cannot be void");
      }
      // TODO: investigate other implementations besides GPtrArray
      cname = is_numeric(etype) ? "GArray" : "GPtrArray";
    }

    /* Omit the dereference operator if we are aliasing this type within a
       typedef, to allow the type to be used more naturally in client code;
       otherwise, include it */
    if (!in_typedef) {
      cname += " *";
    }

    if (is_const) {
      return "const " + cname;
    } else {
      return cname;
    }
  }

  // check for a namespace
  t_program* tprogram = ttype->get_program();
  string pname = (tprogram ? tprogram->get_namespace("c_glib") : "") + ttype->get_name();

  if (is_complex_type(ttype)) {
    pname += " *";
  }

  if (is_const) {
    return "const " + pname;
  } else {
    return pname;
  }
}